

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O3

void peer_disappear(void)

{
  WaitResult<bool> WVar1;
  FindUserDataCallable find_peer2;
  EnsureNoUserDataCallable no_peer2;
  Peer peer2;
  Peer peer1;
  undefined1 local_148 [8];
  char *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  Peer *local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  PeerParameters local_f8;
  Peer local_c8;
  Peer local_b0;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  
  local_f8.min_supported_protocol_version_ = kProtocolVersion1;
  local_f8.max_supported_protocol_version_ = kProtocolVersion1;
  local_f8.can_use_broadcast_ = true;
  local_f8.can_use_multicast_ = false;
  local_f8.discovered_peer_ttl_ms_ = 10000;
  local_f8.discover_self_ = false;
  local_f8.same_peer_mode_ = kSamePeerIpAndPort;
  local_f8.can_be_discovered_ = true;
  local_f8.can_discover_ = true;
  local_f8.port_ = 0x2ef5;
  local_f8.multicast_group_address_ = 0xe000007b;
  local_f8.application_id_ = 0x753584;
  local_f8.send_timeout_ms_ = 100;
  udpdiscovery::Peer::Peer(&local_b0);
  local_148 = (undefined1  [8])&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"peer 1","");
  udpdiscovery::Peer::Start(&local_b0,&local_f8,(string *)local_148);
  if (local_148 != (undefined1  [8])&local_138) {
    operator_delete((void *)local_148);
  }
  udpdiscovery::impl::SleepFor(1000);
  udpdiscovery::Peer::Peer(&local_c8);
  local_148 = (undefined1  [8])&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"peer 2","");
  udpdiscovery::Peer::Start(&local_c8,&local_f8,(string *)local_148);
  if (local_148 != (undefined1  [8])&local_138) {
    operator_delete((void *)local_148);
  }
  local_120 = (Peer *)&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"peer 2","");
  local_148 = (undefined1  [8])&local_b0;
  local_140 = local_138._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_120,(long)local_118 + (long)local_120);
  if (local_120 != (Peer *)&local_110) {
    operator_delete(local_120);
  }
  local_50 = local_148;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,local_140,local_140 + local_138._M_allocated_capacity);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,(FindUserDataCallable *)local_50);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if (((uint3)WVar1 & 1) != 0) {
    __assert_fail("wait_result.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xe9,"void peer_disappear()");
  }
  if (((uint3)WVar1 >> 8 & 1) == 0) {
    __assert_fail("wait_result.has_result == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xea,"void peer_disappear()");
  }
  udpdiscovery::Peer::StopAndWaitForThreads(&local_c8);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"peer 2","");
  local_120 = &local_b0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char*>((string *)&local_118,local_98,local_98 + local_90);
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  local_78 = (undefined1  [8])local_120;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_118,local_118 + local_110);
  WVar1 = Wait<bool,EnsureNoUserDataCallable>(5000,200,(EnsureNoUserDataCallable *)local_78);
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if (((uint3)WVar1 & 1) == 0) {
    if (((uint3)WVar1 >> 8 & 1) != 0) {
      udpdiscovery::Peer::StopAndWaitForThreads(&local_b0);
      if (local_118 != local_108) {
        operator_delete(local_118);
      }
      if (local_140 != local_138._M_local_buf + 8) {
        operator_delete(local_140);
      }
      udpdiscovery::Peer::~Peer(&local_c8);
      udpdiscovery::Peer::~Peer(&local_b0);
      return;
    }
    __assert_fail("wait_result.has_result == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xf3,"void peer_disappear()");
  }
  __assert_fail("wait_result.is_timeout == false",
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                ,0xf2,"void peer_disappear()");
}

Assistant:

void peer_disappear() {
  udpdiscovery::PeerParameters peer_parameters;
  peer_parameters.set_can_discover(true);
  peer_parameters.set_can_be_discovered(true);
  peer_parameters.set_port(kPort);
  peer_parameters.set_application_id(kApplicationId);
  peer_parameters.set_send_timeout_ms(100);
  peer_parameters.set_multicast_group_address(kMulticastAddress);

  udpdiscovery::Peer peer1;
  peer1.Start(peer_parameters, "peer 1");

  // TODO: Understand why do we need this timeout.
  udpdiscovery::impl::SleepFor(1000);

  udpdiscovery::Peer peer2;
  peer2.Start(peer_parameters, "peer 2");

  FindUserDataCallable find_peer2(peer1, "peer 2");
  WaitResult<bool> wait_result =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer2);
  assert(wait_result.is_timeout == false);
  assert(wait_result.has_result == true);

  peer2.StopAndWaitForThreads();

  EnsureNoUserDataCallable no_peer2(peer1, "peer 2");
  wait_result = Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                           /* callable= */ no_peer2);

  assert(wait_result.is_timeout == false);
  assert(wait_result.has_result == true);

  peer1.StopAndWaitForThreads();
}